

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naivelog.cpp
# Opt level: O0

int __thiscall naivelog::write_log(naivelog *this,char *oristr,int length)

{
  size_t sVar1;
  ssize_t sVar2;
  char local_428 [4];
  int ret;
  char str [1024];
  int length_local;
  char *oristr_local;
  naivelog *this_local;
  
  if ((this->enabled & 1U) == 0) {
    this_local._4_4_ = -1;
  }
  else {
    str._1020_4_ = length;
    memset(local_428,0,0x400);
    get_currenttime(this,local_428);
    sVar1 = strlen(local_428);
    str._1020_4_ = str._1020_4_ + (int)sVar1;
    strcat(local_428,oristr);
    sVar2 = write(this->logfd,local_428,(long)(int)str._1020_4_);
    this_local._4_4_ = (int)sVar2;
  }
  return this_local._4_4_;
}

Assistant:

int naivelog::write_log(char *oristr, int length)
{
    if (enabled == false)
        return -1;
    char str[1024];
    memset(str, 0, sizeof(str));
    get_currenttime(str);

    length += strlen(str);
    strcat(str, oristr);

    int ret = 0;

    //日志文件极大地影响了性能。
    //TODO: 改成mmap

#ifdef USE_O_APPEND
    ret = write(logfd, str, length);
    // fsync(fd);
#else
    struct flock lock;
    lock.l_type = F_WRLCK;
    lock.l_whence = SEEK_SET;
    lock.l_start = 0;
    lock.l_len = 0;
    //lock.l_pid = getpid();
    do
    {
        ret = fcntl(logfd, F_SETFL, &lock);
    } while (ret < 0);

    ret = write(logfd, str, length);

    fsync(logfd);
    fcntl(logfd, F_UNLCK, 0);
#endif
    return ret;
}